

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O2

void Abc_TtSwapAdjacent(word *pTruth,int nWords,int iVar)

{
  word *pwVar1;
  ulong uVar2;
  word wVar3;
  uint uVar4;
  uint uVar5;
  word *pLimit;
  byte bVar6;
  int iVar7;
  word *pwVar8;
  ulong uVar9;
  word *pwVar10;
  ulong uVar11;
  
  if (iVar < 5) {
    uVar9 = 0;
    uVar11 = (ulong)(uint)nWords;
    if (nWords < 1) {
      uVar11 = uVar9;
    }
    for (; uVar11 != uVar9; uVar9 = uVar9 + 1) {
      uVar2 = pTruth[uVar9];
      bVar6 = (byte)(1 << ((byte)iVar & 0x1f));
      pTruth[uVar9] =
           (uVar2 & s_PMasks[iVar][2]) >> (bVar6 & 0x3f) |
           (s_PMasks[iVar][1] & uVar2) << (bVar6 & 0x3f) | s_PMasks[iVar][0] & uVar2;
    }
  }
  else {
    pwVar1 = pTruth + nWords;
    if (iVar == 5) {
      for (; pTruth < pwVar1; pTruth = pTruth + 2) {
        *(ulong *)((long)pTruth + 4) =
             CONCAT44((int)*(undefined8 *)((long)pTruth + 4),
                      (int)((ulong)*(undefined8 *)((long)pTruth + 4) >> 0x20));
      }
    }
    else {
      uVar4 = 1 << ((byte)iVar - 6 & 0x1f);
      if ((uint)iVar < 7) {
        uVar4 = 1;
      }
      iVar7 = uVar4 * 4;
      uVar5 = 0;
      if (0 < (int)uVar4) {
        uVar5 = uVar4;
      }
      pwVar8 = pTruth + (int)uVar4;
      pwVar10 = pTruth + (int)(uVar4 * 2);
      for (; pTruth < pwVar1; pTruth = pTruth + iVar7) {
        for (uVar11 = 0; uVar5 != uVar11; uVar11 = uVar11 + 1) {
          wVar3 = pwVar8[uVar11];
          pwVar8[uVar11] = pwVar10[uVar11];
          pwVar10[uVar11] = wVar3;
        }
        pwVar8 = pwVar8 + iVar7;
        pwVar10 = pwVar10 + iVar7;
      }
    }
  }
  return;
}

Assistant:

static inline void Abc_TtSwapAdjacent( word * pTruth, int nWords, int iVar )
{
    if ( iVar < 5 )
    {
        int i, Shift = (1 << iVar);
        for ( i = 0; i < nWords; i++ )
            pTruth[i] = (pTruth[i] & s_PMasks[iVar][0]) | ((pTruth[i] & s_PMasks[iVar][1]) << Shift) | ((pTruth[i] & s_PMasks[iVar][2]) >> Shift);
    }
    else if ( iVar == 5 )
    {
        unsigned * pTruthU = (unsigned *)pTruth;
        unsigned * pLimitU = (unsigned *)(pTruth + nWords);
        for ( ; pTruthU < pLimitU; pTruthU += 4 )
            ABC_SWAP( unsigned, pTruthU[1], pTruthU[2] );
    }
    else // if ( iVar > 5 )
    {
        word * pLimit = pTruth + nWords;
        int i, iStep = Abc_TtWordNum(iVar);
        for ( ; pTruth < pLimit; pTruth += 4*iStep )
            for ( i = 0; i < iStep; i++ )
                ABC_SWAP( word, pTruth[i + iStep], pTruth[i + 2*iStep] );
    }
}